

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall
Search::predictor::make_new_pointer<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,size_t new_size)

{
  uint *__src;
  uint *puVar1;
  uint *__dest;
  
  __src = A->_begin;
  puVar1 = A->_end;
  __dest = calloc_or_throw<unsigned_int>(new_size);
  A->_begin = __dest;
  A->_end = __dest + new_size;
  A->end_array = __dest + new_size;
  memcpy(__dest,__src,(long)puVar1 - (long)__src);
  return;
}

Assistant:

void predictor::make_new_pointer(v_array<T>& A, size_t new_size)
{
  size_t old_size = A.size();
  T* old_pointer = A.begin();
  A.begin() = calloc_or_throw<T>(new_size);
  A.end() = A.begin() + new_size;
  A.end_array = A.end();
  memcpy(A.begin(), old_pointer, old_size * sizeof(T));
}